

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

FloorDivBroadcastableLayerParams * __thiscall
CoreML::Specification::FloorDivBroadcastableLayerParams::New
          (FloorDivBroadcastableLayerParams *this,Arena *arena)

{
  FloorDivBroadcastableLayerParams *this_00;
  
  this_00 = (FloorDivBroadcastableLayerParams *)operator_new(0x18);
  FloorDivBroadcastableLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::FloorDivBroadcastableLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

FloorDivBroadcastableLayerParams* FloorDivBroadcastableLayerParams::New(::google::protobuf::Arena* arena) const {
  FloorDivBroadcastableLayerParams* n = new FloorDivBroadcastableLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}